

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * __thiscall
google::protobuf::Reflection::MutableMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  bool bVar1;
  uint32_t uVar2;
  Message **ppMVar3;
  OneofDescriptor *pOVar4;
  MessageLite *pMVar5;
  char *description;
  Arena *pAVar6;
  Descriptor *pDVar7;
  Metadata MVar8;
  
  MVar8 = Message::GetMetadata(message);
  if (MVar8.reflection != this) {
    pDVar7 = this->descriptor_;
    MVar8 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar7,MVar8.descriptor,field,"MutableMessage");
  }
  pDVar7 = this->descriptor_;
  if (field->containing_type_ != pDVar7) {
    description = "Field does not match message type.";
LAB_00352531:
    anon_unknown_6::ReportReflectionUsageError(pDVar7,field,"MutableMessage",description);
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    pDVar7 = this->descriptor_;
    description = "Field is repeated; the method requires a singular field.";
    goto LAB_00352531;
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,field,"MutableMessage",CPPTYPE_MESSAGE);
  }
  if ((field->field_0x1 & 8) != 0) {
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    pMVar5 = internal::ExtensionSet::MutableMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),field
                        ,factory);
    return (Message *)pMVar5;
  }
  ppMVar3 = MutableRaw<google::protobuf::Message*>(this,message,field);
  pOVar4 = FieldDescriptor::real_containing_oneof(field);
  if (pOVar4 == (OneofDescriptor *)0x0) {
    SetHasBit(this,message,field);
  }
  else {
    bVar1 = HasOneofField(this,message,field);
    if (!bVar1) {
      pOVar4 = FieldDescriptor::containing_oneof(field);
      ClearOneof(this,message,pOVar4);
      ppMVar3 = MutableField<google::protobuf::Message*>(this,message,field);
      pMVar5 = &GetDefaultMessageInstance(this,field)->super_MessageLite;
      pAVar6 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pAVar6 & 1) != 0) {
        pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
      }
      pMVar5 = MessageLite::New(pMVar5,pAVar6);
      *ppMVar3 = (Message *)pMVar5;
      goto LAB_003524a9;
    }
  }
  pMVar5 = &(*ppMVar3)->super_MessageLite;
LAB_003524a9:
  if (pMVar5 == (MessageLite *)0x0) {
    pMVar5 = &GetDefaultMessageInstance(this,field)->super_MessageLite;
    pAVar6 = (Arena *)(message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
    }
    pMVar5 = MessageLite::New(pMVar5,pAVar6);
    *ppMVar3 = (Message *)pMVar5;
  }
  return (Message *)pMVar5;
}

Assistant:

Message* Reflection::MutableMessage(Message* message,
                                    const FieldDescriptor* field,
                                    MessageFactory* factory) const {
  USAGE_MUTABLE_CHECK_ALL(MutableMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableMessage(field, factory));
  } else {
    Message* result;

    Message** result_holder = MutableRaw<Message*>(message, field);

    if (schema_.InRealOneof(field)) {
      if (!HasOneofField(*message, field)) {
        ClearOneof(message, field->containing_oneof());
        result_holder = MutableField<Message*>(message, field);
        const Message* default_message = GetDefaultMessageInstance(field);
        *result_holder = default_message->New(message->GetArena());
      }
    } else {
      SetHasBit(message, field);
    }

    if (*result_holder == nullptr) {
      const Message* default_message = GetDefaultMessageInstance(field);
      *result_holder = default_message->New(message->GetArena());
    }
    result = *result_holder;
    return result;
  }
}